

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

ostream * doctest::operator<<(ostream *s,String *in)

{
  char *pcVar1;
  ostream *poVar2;
  ostream *in_RDI;
  
  pcVar1 = String::c_str((String *)0x10ed61);
  poVar2 = std::operator<<(in_RDI,pcVar1);
  return poVar2;
}

Assistant:

std::ostream& operator<<(std::ostream& s, const String& in) { return s << in.c_str(); }